

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t psa_hash_setup(psa_hash_operation_t *operation,psa_algorithm_t alg)

{
  int local_20;
  int ret;
  psa_algorithm_t alg_local;
  psa_hash_operation_t *operation_local;
  
  if (operation->alg == 0) {
    switch(alg) {
    case 0x1000003:
      mbedtls_md5_init(&(operation->ctx).md5);
      local_20 = mbedtls_md5_starts_ret(&(operation->ctx).md5);
      break;
    case 0x1000004:
      mbedtls_ripemd160_init(&(operation->ctx).ripemd160);
      local_20 = mbedtls_ripemd160_starts_ret(&(operation->ctx).ripemd160);
      break;
    case 0x1000005:
      mbedtls_sha1_init(&(operation->ctx).sha1);
      local_20 = mbedtls_sha1_starts_ret(&(operation->ctx).sha1);
      break;
    default:
      if ((alg & 0x7f000000) != 0x1000000) {
        return -0x87;
      }
      return -0x86;
    case 0x1000008:
      mbedtls_sha256_init(&(operation->ctx).sha256);
      local_20 = mbedtls_sha256_starts_ret(&(operation->ctx).sha256,1);
      break;
    case 0x1000009:
      mbedtls_sha256_init(&(operation->ctx).sha256);
      local_20 = mbedtls_sha256_starts_ret(&(operation->ctx).sha256,0);
      break;
    case 0x100000a:
      mbedtls_sha512_init(&(operation->ctx).sha512);
      local_20 = mbedtls_sha512_starts_ret(&(operation->ctx).sha512,1);
      break;
    case 0x100000b:
      mbedtls_sha512_init(&(operation->ctx).sha512);
      local_20 = mbedtls_sha512_starts_ret(&(operation->ctx).sha512,0);
    }
    if (local_20 == 0) {
      operation->alg = alg;
    }
    else {
      psa_hash_abort(operation);
    }
    operation_local._4_4_ = mbedtls_to_psa_error(local_20);
  }
  else {
    operation_local._4_4_ = -0x89;
  }
  return operation_local._4_4_;
}

Assistant:

psa_status_t psa_hash_setup( psa_hash_operation_t *operation,
                             psa_algorithm_t alg )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    /* A context must be freshly initialized before it can be set up. */
    if( operation->alg != 0 )
    {
        return( PSA_ERROR_BAD_STATE );
    }

    switch( alg )
    {
#if defined(MBEDTLS_MD2_C)
        case PSA_ALG_MD2:
            mbedtls_md2_init( &operation->ctx.md2 );
            ret = mbedtls_md2_starts_ret( &operation->ctx.md2 );
            break;
#endif
#if defined(MBEDTLS_MD4_C)
        case PSA_ALG_MD4:
            mbedtls_md4_init( &operation->ctx.md4 );
            ret = mbedtls_md4_starts_ret( &operation->ctx.md4 );
            break;
#endif
#if defined(MBEDTLS_MD5_C)
        case PSA_ALG_MD5:
            mbedtls_md5_init( &operation->ctx.md5 );
            ret = mbedtls_md5_starts_ret( &operation->ctx.md5 );
            break;
#endif
#if defined(MBEDTLS_RIPEMD160_C)
        case PSA_ALG_RIPEMD160:
            mbedtls_ripemd160_init( &operation->ctx.ripemd160 );
            ret = mbedtls_ripemd160_starts_ret( &operation->ctx.ripemd160 );
            break;
#endif
#if defined(MBEDTLS_SHA1_C)
        case PSA_ALG_SHA_1:
            mbedtls_sha1_init( &operation->ctx.sha1 );
            ret = mbedtls_sha1_starts_ret( &operation->ctx.sha1 );
            break;
#endif
#if defined(MBEDTLS_SHA256_C)
        case PSA_ALG_SHA_224:
            mbedtls_sha256_init( &operation->ctx.sha256 );
            ret = mbedtls_sha256_starts_ret( &operation->ctx.sha256, 1 );
            break;
        case PSA_ALG_SHA_256:
            mbedtls_sha256_init( &operation->ctx.sha256 );
            ret = mbedtls_sha256_starts_ret( &operation->ctx.sha256, 0 );
            break;
#endif
#if defined(MBEDTLS_SHA512_C)
#if !defined(MBEDTLS_SHA512_NO_SHA384)
        case PSA_ALG_SHA_384:
            mbedtls_sha512_init( &operation->ctx.sha512 );
            ret = mbedtls_sha512_starts_ret( &operation->ctx.sha512, 1 );
            break;
#endif
        case PSA_ALG_SHA_512:
            mbedtls_sha512_init( &operation->ctx.sha512 );
            ret = mbedtls_sha512_starts_ret( &operation->ctx.sha512, 0 );
            break;
#endif
        default:
            return( PSA_ALG_IS_HASH( alg ) ?
                    PSA_ERROR_NOT_SUPPORTED :
                    PSA_ERROR_INVALID_ARGUMENT );
    }
    if( ret == 0 )
        operation->alg = alg;
    else
        psa_hash_abort( operation );
    return( mbedtls_to_psa_error( ret ) );
}